

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O2

ChConstraintTwoBodies * __thiscall
chrono::ChConstraintTwoBodies::operator=(ChConstraintTwoBodies *this,ChConstraintTwoBodies *other)

{
  ChVariables *pCVar1;
  
  if (other != this) {
    ChConstraintTwo::operator=(&this->super_ChConstraintTwo,&other->super_ChConstraintTwo);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
              (&this->Cq_a,&other->Cq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
              (&this->Cq_b,&other->Cq_b);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&this->Eq_a,&other->Eq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&this->Eq_b,&other->Eq_b);
    pCVar1 = (other->super_ChConstraintTwo).variables_b;
    (this->super_ChConstraintTwo).variables_a = (other->super_ChConstraintTwo).variables_a;
    (this->super_ChConstraintTwo).variables_b = pCVar1;
  }
  return this;
}

Assistant:

ChConstraintTwoBodies& ChConstraintTwoBodies::operator=(const ChConstraintTwoBodies& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintTwo::operator=(other);

    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;

    this->variables_a = other.variables_a;
    this->variables_b = other.variables_b;

    return *this;
}